

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O2

void __thiscall
spvtools::val::ValidationState_t::ComputeRecursiveEntryPoints(ValidationState_t *this)

{
  _Rb_tree_header *p_Var1;
  pointer puVar2;
  _Base_ptr p_Var3;
  _Elt_pointer puVar4;
  Function *pFVar5;
  mapped_type *pmVar6;
  pointer puVar7;
  pointer pFVar8;
  pair<std::_Rb_tree_iterator<unsigned_int>,_bool> pVar9;
  uint32_t new_call;
  uint32_t new_call_1;
  uint32_t entry_point;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> visited;
  stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> call_stack;
  _Rb_tree_color local_114;
  pointer local_110;
  _Rb_tree_color local_104;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_100;
  ValidationState_t *local_f8;
  pointer local_f0;
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  *local_e8;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_e0;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_b0;
  _Deque_base<unsigned_int,_std::allocator<unsigned_int>_> local_80;
  
  pFVar8 = (this->module_functions_).
           super__Vector_base<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_f0 = (this->module_functions_).
             super__Vector_base<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  p_Var1 = &local_e0._M_impl.super__Rb_tree_header;
  local_100 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               *)&this->function_to_entry_points_;
  local_e8 = (_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              *)&this->recursive_entry_points_;
  local_f8 = this;
  do {
    if (pFVar8 == local_f0) {
      return;
    }
    std::stack<unsigned_int,std::deque<unsigned_int,std::allocator<unsigned_int>>>::
    stack<std::deque<unsigned_int,std::allocator<unsigned_int>>,void>
              ((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_80);
    local_b0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_b0._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_b0._M_impl.super__Rb_tree_header._M_header;
    local_b0._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_110 = pFVar8;
    local_b0._M_impl.super__Rb_tree_header._M_header._M_right =
         local_b0._M_impl.super__Rb_tree_header._M_header._M_left;
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::_Rb_tree(&local_e0,&(pFVar8->function_call_targets_)._M_t);
    for (p_Var3 = local_e0._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != p_Var1; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      local_114 = p_Var3[1]._M_color;
      std::deque<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)&local_80,&local_114);
    }
LAB_00192c73:
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&local_e0);
    pFVar8 = local_110;
    while( true ) {
      do {
        if (local_80._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_80._M_impl.super__Deque_impl_data._M_start._M_cur) goto LAB_00192d6d;
        puVar4 = local_80._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_80._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_80._M_impl.super__Deque_impl_data._M_finish._M_first) {
          puVar4 = local_80._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
        }
        local_114 = puVar4[-1];
        std::deque<unsigned_int,_std::allocator<unsigned_int>_>::pop_back
                  ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)&local_80);
        pVar9 = std::
                _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                ::_M_insert_unique<unsigned_int_const&>
                          ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                            *)&local_b0,&local_114);
      } while (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
      if (local_114 == pFVar8->id_) break;
      pFVar5 = function(this,local_114);
      if (pFVar5 != (Function *)0x0) goto code_r0x00192ced;
    }
    pmVar6 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[](local_100,&local_114);
    puVar2 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (puVar7 = (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start; this = local_f8, pFVar8 = local_110,
        puVar7 != puVar2; puVar7 = puVar7 + 1) {
      local_e0._M_impl._0_4_ = *puVar7;
      std::
      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
      ::_M_insert_unique<unsigned_int_const&>(local_e8,(uint *)&local_e0);
    }
LAB_00192d6d:
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&local_b0);
    std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base(&local_80);
    pFVar8 = pFVar8 + 1;
  } while( true );
code_r0x00192ced:
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::_Rb_tree(&local_e0,&(pFVar5->function_call_targets_)._M_t);
  for (p_Var3 = local_e0._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != p_Var1; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    local_104 = p_Var3[1]._M_color;
    std::deque<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)&local_80,&local_104);
  }
  goto LAB_00192c73;
}

Assistant:

void ValidationState_t::ComputeRecursiveEntryPoints() {
  for (const Function& func : functions()) {
    std::stack<uint32_t> call_stack;
    std::set<uint32_t> visited;

    for (const uint32_t new_call : func.function_call_targets()) {
      call_stack.push(new_call);
    }

    while (!call_stack.empty()) {
      const uint32_t called_func_id = call_stack.top();
      call_stack.pop();

      if (!visited.insert(called_func_id).second) continue;

      if (called_func_id == func.id()) {
        for (const uint32_t entry_point :
             function_to_entry_points_[called_func_id])
          recursive_entry_points_.insert(entry_point);
        break;
      }

      const Function* called_func = function(called_func_id);
      if (called_func) {
        // Other checks should error out on this invalid SPIR-V.
        for (const uint32_t new_call : called_func->function_call_targets()) {
          call_stack.push(new_call);
        }
      }
    }
  }
}